

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predefined_formatters.h
# Opt level: O1

SimpleDateFormat * __thiscall
booster::locale::impl_icu::icu_formatters_cache::date_formatter(icu_formatters_cache *this)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleDateFormat *pSVar2;
  long lVar3;
  SimpleDateFormat *pSVar4;
  
  iVar1 = (*(((this->date_formatter_).key_.p_)->super_refcounted)._vptr_refcounted[2])();
  pSVar2 = *(SimpleDateFormat **)(CONCAT44(extraout_var,iVar1) + 8);
  if (pSVar2 == (SimpleDateFormat *)0x0) {
    pSVar2 = (SimpleDateFormat *)
             icu_70::DateFormat::createDateTimeInstance(DEFAULT,DEFAULT,&this->locale_);
    if ((pSVar2 == (SimpleDateFormat *)0x0) ||
       (lVar3 = __dynamic_cast(pSVar2,&icu_70::DateFormat::typeinfo,
                               &icu_70::SimpleDateFormat::typeinfo,0), lVar3 == 0)) {
      pSVar4 = (SimpleDateFormat *)0x0;
    }
    else {
      thread_specific_ptr<icu_70::SimpleDateFormat>::reset(&this->date_formatter_,pSVar2);
      pSVar4 = pSVar2;
      pSVar2 = (SimpleDateFormat *)0x0;
    }
    if (pSVar2 != (SimpleDateFormat *)0x0) {
      (**(code **)(*(long *)pSVar2 + 8))();
    }
    return pSVar4;
  }
  return pSVar2;
}

Assistant:

icu::SimpleDateFormat *date_formatter() const
            {
                icu::SimpleDateFormat *p=date_formatter_.get();
                if(p)
                    return p;

                std::unique_ptr<icu::DateFormat> fmt(icu::DateFormat::createDateTimeInstance(
                    icu::DateFormat::kMedium,
                    icu::DateFormat::kMedium,
                    locale_));
                
                if(dynamic_cast<icu::SimpleDateFormat *>(fmt.get())) {
                    p = static_cast<icu::SimpleDateFormat *>(fmt.release());
                    date_formatter_.reset(p);
                }
                return p;
            }